

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS
ref_collapse_edge_tri_quality(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  REF_INT cell;
  REF_DBL area;
  REF_DBL quality;
  REF_INT nodes [27];
  int local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  *allowed = 0;
  ref_cell = ref_grid->cell[3];
  uVar6 = 0xffffffff;
  if (-1 < node1) {
    uVar6 = 0xffffffff;
    if (node1 < ref_cell->ref_adj->nnode) {
      uVar6 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node1];
    }
  }
  if ((int)uVar6 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar6].ref;
    do {
      uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x324,"ref_collapse_edge_tri_quality",(ulong)uVar4,"nodes");
        return uVar4;
      }
      if ((long)ref_cell->node_per < 1) {
LAB_001f191c:
        if (0 < ref_cell->node_per) {
          lVar5 = 0;
          do {
            if (local_a8[lVar5] == node1) {
              local_a8[lVar5] = node0;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < ref_cell->node_per);
        }
        uVar4 = ref_node_tri_quality(ref_node,local_a8,&local_b0);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x330,"ref_collapse_edge_tri_quality",(ulong)uVar4,"qual");
          return uVar4;
        }
        if (local_b0 < ref_grid->adapt->collapse_quality_absolute) {
          return 0;
        }
        uVar4 = ref_node_tri_area(ref_node,local_a8,&local_b8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x335,"ref_collapse_edge_tri_quality",(ulong)uVar4,"vol");
          return uVar4;
        }
        if (local_b8 <= ref_node->min_volume) {
          return 0;
        }
      }
      else {
        lVar5 = 0;
        bVar3 = false;
        do {
          if (local_a8[lVar5] == node0) {
            bVar3 = true;
          }
          lVar5 = lVar5 + 1;
        } while (ref_cell->node_per != lVar5);
        if (!bVar3) goto LAB_001f191c;
      }
      pRVar2 = ref_cell->ref_adj->item;
      local_c0 = (int)uVar6;
      iVar1 = pRVar2[local_c0].next;
      uVar6 = (ulong)iVar1;
      if (uVar6 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar6].ref;
      }
    } while (iVar1 != -1);
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_tri_quality(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_DBL quality, area;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "qual");
    if (quality < ref_grid_adapt(ref_grid, collapse_quality_absolute))
      return REF_SUCCESS;

    /* for twod, should not hurt 3D */
    RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
    if (area <= ref_node_min_volume(ref_node)) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}